

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool __thiscall BCLog::Logger::WillLogCategory(Logger *this,LogFlags category)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  memory_order __b;
  __memory_order_modifier in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator&(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (*(ulong *)(in_RDI + 0xb0) & in_RSI) != 0;
}

Assistant:

bool BCLog::Logger::WillLogCategory(BCLog::LogFlags category) const
{
    return (m_categories.load(std::memory_order_relaxed) & category) != 0;
}